

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall pfederc::ClassExpr::~ClassExpr(ClassExpr *this)

{
  ~ClassExpr(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

ClassExpr::~ClassExpr() {
}